

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O1

void __thiscall
qclab::qgates::QGate1<std::complex<float>_>::apply
          (QGate1<std::complex<float>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<float>_> *matrix,int offset)

{
  complex<float> cVar1;
  _ComplexT _Var2;
  complex<float> *pcVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  undefined8 uVar18;
  ulong uVar19;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  float fVar28;
  float fVar29;
  SquareMatrix<std::complex<float>_> mat1;
  SquareMatrix<std::complex<float>_> local_a8;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  SquareMatrix<std::complex<float>_> local_78;
  SquareMatrix<std::complex<float>_> local_68;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (nbQubits < 1) {
    __assert_fail("nbQubits >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x1f,
                  "virtual void qclab::qgates::QGate1<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x20,
                  "virtual void qclab::qgates::QGate1<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  iVar4 = (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[3])();
  uVar5 = iVar4 + offset;
  if (nbQubits <= (int)uVar5) {
    __assert_fail("qubit < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x22,
                  "virtual void qclab::qgates::QGate1<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[7])(&local_a8,this);
  dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>(op,&local_a8);
  if (side == Left) {
    if (nbQubits == 1) {
      dense::SquareMatrix<std::complex<float>_>::operator*=(matrix,&local_a8);
    }
    else if (0 < matrix->size_) {
      lVar15 = (long)(1 << ((byte)(~uVar5 + nbQubits) & 0x1f));
      uVar9 = 1 << ((byte)uVar5 & 0x1f);
      lVar10 = 1;
      if (1 < lVar15) {
        lVar10 = lVar15;
      }
      if ((int)uVar9 < 2) {
        uVar9 = 1;
      }
      lVar14 = 0;
      do {
        if (uVar5 != 0x1f) {
          lVar11 = 0;
          uVar6 = 0;
          do {
            lVar12 = lVar10;
            lVar13 = lVar11;
            if (~uVar5 + nbQubits != 0x1f) {
              do {
                pcVar3 = (matrix->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                         .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                lVar8 = matrix->size_ * lVar13;
                fVar17 = *(float *)&pcVar3[lVar8 + lVar14]._M_value;
                fVar22 = *(float *)((long)&pcVar3[lVar8 + lVar14]._M_value + 4);
                lVar8 = matrix->size_ * (lVar15 + lVar13);
                fVar23 = *(float *)&pcVar3[lVar8 + lVar14]._M_value;
                fVar24 = *(float *)((long)&pcVar3[lVar8 + lVar14]._M_value + 4);
                cVar1._M_value =
                     *(_ComplexT *)
                      local_a8.data_._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                fVar16 = (float)(cVar1._M_value >> 0x20);
                uVar26 = 0;
                uVar27 = 0;
                fVar25 = fVar17 * (float)cVar1._M_value - fVar22 * fVar16;
                fVar28 = fVar17 * fVar16 + fVar22 * (float)cVar1._M_value;
                fVar29 = 0.0;
                if ((NAN(fVar25)) && (NAN(fVar28))) {
                  local_98 = fVar24;
                  local_88 = fVar23;
                  uVar18 = __mulsc3(cVar1._M_value,fVar16,fVar17,fVar22);
                  fVar25 = (float)uVar18;
                  fVar28 = (float)((ulong)uVar18 >> 0x20);
                  uVar26 = (undefined4)extraout_XMM0_Qb;
                  uVar27 = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
                  fVar23 = local_88;
                  fVar24 = local_98;
                  fVar29 = fVar28;
                }
                _Var2 = ((complex<float> *)
                        ((long)local_a8.data_._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 8
                        ))->_M_value;
                fVar20 = (float)(_Var2 >> 0x20);
                fVar16 = fVar23 * (float)_Var2 - fVar24 * fVar20;
                uVar19 = (ulong)(uint)fVar16;
                fVar21 = fVar23 * fVar20 + fVar24 * (float)_Var2;
                if ((NAN(fVar16)) && (NAN(fVar21))) {
                  local_98 = fVar24;
                  local_88 = fVar23;
                  local_58 = fVar28;
                  fStack_54 = fVar29;
                  fStack_50 = fVar29;
                  fStack_4c = fVar29;
                  local_48 = fVar25;
                  fStack_44 = fVar29;
                  uStack_40 = uVar26;
                  uStack_3c = uVar27;
                  uVar19 = __mulsc3(_Var2,fVar20,fVar23,fVar24);
                  fVar21 = (float)(uVar19 >> 0x20);
                  fVar23 = local_88;
                  fVar24 = local_98;
                  fVar25 = local_48;
                  fVar28 = local_58;
                }
                (matrix->data_)._M_t.
                super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                [matrix->size_ * lVar13 + lVar14]._M_value =
                     CONCAT44(fVar28 + fVar21,fVar25 + (float)uVar19);
                _Var2 = ((complex<float> *)
                        ((long)local_a8.data_._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl +
                        local_a8.size_ * 8))->_M_value;
                fVar16 = (float)(_Var2 >> 0x20);
                uVar26 = 0;
                uVar27 = 0;
                fVar25 = fVar17 * (float)_Var2 - fVar22 * fVar16;
                fVar28 = fVar17 * fVar16 + fVar22 * (float)_Var2;
                fVar29 = 0.0;
                if ((NAN(fVar25)) && (NAN(fVar28))) {
                  local_98 = fVar24;
                  local_88 = fVar23;
                  uVar18 = __mulsc3(_Var2,fVar16,fVar17,fVar22);
                  fVar25 = (float)uVar18;
                  fVar28 = (float)((ulong)uVar18 >> 0x20);
                  uVar26 = (undefined4)extraout_XMM0_Qb_00;
                  uVar27 = (undefined4)((ulong)extraout_XMM0_Qb_00 >> 0x20);
                  fVar23 = local_88;
                  fVar24 = local_98;
                  fVar29 = fVar28;
                }
                _Var2 = ((complex<float> *)
                        ((long)local_a8.data_._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl +
                        (local_a8.size_ + 1) * 8))->_M_value;
                fVar16 = (float)(_Var2 >> 0x20);
                fVar17 = fVar23 * (float)_Var2 - fVar24 * fVar16;
                uVar19 = (ulong)(uint)fVar17;
                fVar22 = fVar23 * fVar16 + fVar24 * (float)_Var2;
                if ((NAN(fVar17)) && (NAN(fVar22))) {
                  local_98 = fVar28;
                  fStack_94 = fVar29;
                  fStack_90 = fVar29;
                  fStack_8c = fVar29;
                  local_88 = fVar25;
                  fStack_84 = fVar29;
                  uStack_80 = uVar26;
                  uStack_7c = uVar27;
                  uVar19 = __mulsc3(_Var2,fVar16,fVar23,fVar24);
                  fVar22 = (float)(uVar19 >> 0x20);
                  fVar25 = local_88;
                  fVar28 = local_98;
                }
                (matrix->data_)._M_t.
                super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                [(lVar15 + lVar13) * matrix->size_ + lVar14]._M_value =
                     CONCAT44(fVar28 + fVar22,fVar25 + (float)uVar19);
                lVar13 = lVar13 + 1;
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
            }
            uVar6 = uVar6 + 1;
            lVar11 = lVar11 + lVar15 * 2;
          } while (uVar6 != uVar9);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < matrix->size_);
    }
  }
  else if (nbQubits == 1) {
    dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&local_78,&local_a8);
    dense::SquareMatrix<std::complex<float>_>::operator*=(&local_78,matrix);
    dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&local_68,&local_78);
    dense::SquareMatrix<std::complex<float>_>::operator=(matrix,&local_68);
    if ((_Head_base<0UL,_std::complex<float>_*,_false>)
        local_68.data_._M_t.
        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t
        .super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
        super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
        (_Head_base<0UL,_std::complex<float>_*,_false>)0x0) {
      operator_delete__((void *)local_68.data_._M_t.
                                super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
    }
    local_68.data_._M_t.
    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
    super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
          )(__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0;
    if (local_78.data_._M_t.
        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t
        .super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
        super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
      operator_delete__((void *)local_78.data_._M_t.
                                super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
    }
    local_78.data_._M_t.
    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
    super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
          )(__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0;
  }
  else if (0 < matrix->size_) {
    lVar15 = (long)(1 << ((byte)(~uVar5 + nbQubits) & 0x1f));
    uVar9 = 1 << ((byte)uVar5 & 0x1f);
    lVar10 = 1;
    if (1 < lVar15) {
      lVar10 = lVar15;
    }
    if ((int)uVar9 < 2) {
      uVar9 = 1;
    }
    lVar11 = 0;
    lVar14 = 0;
    do {
      if (uVar5 != 0x1f) {
        lVar12 = 0;
        uVar6 = 0;
        do {
          lVar13 = lVar12;
          lVar8 = lVar10;
          if (~uVar5 + nbQubits != 0x1f) {
            do {
              lVar7 = matrix->size_ * lVar11;
              pcVar3 = (matrix->data_)._M_t.
                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                       .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
              fVar17 = *(float *)((long)&pcVar3->_M_value + lVar13 + lVar7);
              fVar22 = *(float *)((long)&pcVar3->_M_value + lVar13 + 4 + lVar7);
              fVar23 = *(float *)((long)&pcVar3[lVar15]._M_value + lVar13 + lVar7);
              fVar24 = *(float *)((long)&pcVar3[lVar15]._M_value + lVar13 + lVar7 + 4);
              cVar1._M_value =
                   *(_ComplexT *)
                    local_a8.data_._M_t.
                    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                    .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
              fVar16 = (float)(cVar1._M_value >> 0x20);
              uVar26 = 0;
              uVar27 = 0;
              fVar25 = fVar17 * (float)cVar1._M_value - fVar22 * fVar16;
              fVar28 = fVar17 * fVar16 + fVar22 * (float)cVar1._M_value;
              fVar29 = 0.0;
              if ((NAN(fVar25)) && (NAN(fVar28))) {
                local_98 = fVar24;
                local_88 = fVar23;
                uVar18 = __mulsc3(cVar1._M_value,fVar16,fVar17,fVar22);
                fVar25 = (float)uVar18;
                fVar28 = (float)((ulong)uVar18 >> 0x20);
                uVar26 = (undefined4)extraout_XMM0_Qb_01;
                uVar27 = (undefined4)((ulong)extraout_XMM0_Qb_01 >> 0x20);
                fVar23 = local_88;
                fVar24 = local_98;
                fVar29 = fVar28;
              }
              _Var2 = ((complex<float> *)
                      ((long)local_a8.data_._M_t.
                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl +
                      local_a8.size_ * 8))->_M_value;
              fVar20 = (float)(_Var2 >> 0x20);
              fVar16 = fVar23 * (float)_Var2 - fVar24 * fVar20;
              uVar19 = (ulong)(uint)fVar16;
              fVar21 = fVar23 * fVar20 + fVar24 * (float)_Var2;
              if ((NAN(fVar16)) && (NAN(fVar21))) {
                local_98 = fVar24;
                local_88 = fVar23;
                local_58 = fVar28;
                fStack_54 = fVar29;
                fStack_50 = fVar29;
                fStack_4c = fVar29;
                local_48 = fVar25;
                fStack_44 = fVar29;
                uStack_40 = uVar26;
                uStack_3c = uVar27;
                uVar19 = __mulsc3(_Var2,fVar20,fVar23,fVar24);
                fVar21 = (float)(uVar19 >> 0x20);
                fVar23 = local_88;
                fVar24 = local_98;
                fVar25 = local_48;
                fVar28 = local_58;
              }
              *(ulong *)((long)&((matrix->data_)._M_t.
                                 super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                 .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl)
                                ->_M_value + lVar13 + matrix->size_ * lVar11) =
                   CONCAT44(fVar28 + fVar21,fVar25 + (float)uVar19);
              _Var2 = ((complex<float> *)
                      ((long)local_a8.data_._M_t.
                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 8))
                      ->_M_value;
              fVar16 = (float)(_Var2 >> 0x20);
              uVar26 = 0;
              uVar27 = 0;
              fVar25 = fVar17 * (float)_Var2 - fVar22 * fVar16;
              fVar28 = fVar17 * fVar16 + fVar22 * (float)_Var2;
              fVar29 = 0.0;
              if ((NAN(fVar25)) && (NAN(fVar28))) {
                local_98 = fVar24;
                local_88 = fVar23;
                uVar18 = __mulsc3(_Var2,fVar16,fVar17,fVar22);
                fVar25 = (float)uVar18;
                fVar28 = (float)((ulong)uVar18 >> 0x20);
                uVar26 = (undefined4)extraout_XMM0_Qb_02;
                uVar27 = (undefined4)((ulong)extraout_XMM0_Qb_02 >> 0x20);
                fVar23 = local_88;
                fVar24 = local_98;
                fVar29 = fVar28;
              }
              _Var2 = ((complex<float> *)
                      ((long)local_a8.data_._M_t.
                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl +
                      (local_a8.size_ + 1) * 8))->_M_value;
              fVar16 = (float)(_Var2 >> 0x20);
              fVar17 = fVar23 * (float)_Var2 - fVar24 * fVar16;
              uVar19 = (ulong)(uint)fVar17;
              fVar22 = fVar23 * fVar16 + fVar24 * (float)_Var2;
              if ((NAN(fVar17)) && (NAN(fVar22))) {
                local_98 = fVar28;
                fStack_94 = fVar29;
                fStack_90 = fVar29;
                fStack_8c = fVar29;
                local_88 = fVar25;
                fStack_84 = fVar29;
                uStack_80 = uVar26;
                uStack_7c = uVar27;
                uVar19 = __mulsc3(_Var2,fVar16,fVar23,fVar24);
                fVar22 = (float)(uVar19 >> 0x20);
                fVar25 = local_88;
                fVar28 = local_98;
              }
              *(ulong *)((long)&(matrix->data_)._M_t.
                                super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                                [lVar15]._M_value + lVar13 + matrix->size_ * lVar11) =
                   CONCAT44(fVar28 + fVar22,fVar25 + (float)uVar19);
              lVar13 = lVar13 + 8;
              lVar8 = lVar8 + -1;
            } while (lVar8 != 0);
          }
          uVar6 = uVar6 + 1;
          lVar12 = lVar12 + lVar15 * 0x10;
        } while (uVar6 != uVar9);
      }
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 8;
    } while (lVar14 < matrix->size_);
  }
  if (local_a8.data_._M_t.
      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
      super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
    operator_delete__((void *)local_a8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                              .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void QGate1< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 1 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    const int qubit = this->qubit() + offset ;
    assert( qubit < nbQubits ) ;
    // operation
    qclab::dense::SquareMatrix< T >  mat1 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 1 ) {
        matrix *= mat1 ;
      } else {
        // matrix *= kron( Ileft , mat1 , Iright )
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 1 ) {
        matrix = mat1 * matrix ;
      } else {
        // matrix = kron( Ileft , mat1 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }